

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::ReturnValueVerifier::operator()
          (ReturnValueVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ostringstream *this_00;
  ostringstream *this_01;
  ostringstream *this_02;
  ChannelType CVar1;
  AtomicOperation operation;
  bool bVar2;
  deUint32 value;
  int iVar3;
  char *__s;
  ConstPixelBufferAccess *__n;
  uint y;
  void *__buf;
  Vector<int,_2> (*arr) [5];
  float (*arr_00) [5];
  Vector<int,_3> (*arr_01) [5];
  float (*arr_02) [5];
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  IVec3 *pIVar8;
  bool bVar9;
  float valueSoFar;
  int sliceOrFaceNdx_local;
  allocator<char> local_609;
  ConstPixelBufferAccess *local_608;
  TestLog *local_600;
  IVec2 local_5f8;
  IntFloatArr atomicArgs;
  IntFloatArr returnValues;
  IVec2 pixelCoords [5];
  ulong local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  IVec3 invocationGlobalIDs [5];
  undefined1 local_4b0 [384];
  IVec3 gid;
  undefined1 local_1b0 [384];
  
  CVar1 = (resultSlice->m_format).type;
  if ((0x21 < (ulong)CVar1) || (bVar9 = true, (0x2c0000000U >> ((ulong)CVar1 & 0x3f) & 1) == 0)) {
    bVar9 = CVar1 - SIGNED_INT8 < 3;
  }
  local_5f8.m_data = *(int (*) [2])(resultSlice->m_size).m_data;
  sliceOrFaceNdx_local = sliceOrFaceNdx;
  local_608 = resultSlice;
  local_600 = log;
  de::toString<int>((string *)local_1b0,&sliceOrFaceNdx_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gid,
                 "ReturnValues",(string *)local_1b0);
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    value = cubeFaceToGLFace((&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::
                               faces)[sliceOrFaceNdx_local]);
    __s = glu::getCubeMapFaceName(value);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,__s,&local_609);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pixelCoords,
                   "face ",&local_598);
  }
  else {
    de::toString<int>(&local_598,&sliceOrFaceNdx_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pixelCoords,
                   "slice ",&local_598);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 invocationGlobalIDs,"Per-Invocation Return Values, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pixelCoords);
  __n = local_608;
  tcu::LogImage::LogImage
            ((LogImage *)local_4b0,(string *)&gid,(string *)invocationGlobalIDs,local_608,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_4b0,(int)local_600,__buf,(size_t)__n);
  tcu::LogImage::~LogImage((LogImage *)local_4b0);
  std::__cxx11::string::~string((string *)invocationGlobalIDs);
  std::__cxx11::string::~string((string *)pixelCoords);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&gid);
  std::__cxx11::string::~string((string *)local_1b0);
  lVar5 = 0;
  do {
    uVar4 = (ulong)(this->m_endResultImageLayerSize).m_data[1];
    if ((long)uVar4 <= lVar5) {
LAB_0125bc9c:
      return (long)uVar4 <= lVar5;
    }
    local_5a0 = uVar4;
    for (iVar6 = 0; iVar6 < (this->m_endResultImageLayerSize).m_data[0]; iVar6 = iVar6 + 1) {
      lVar7 = 0;
      do {
        tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)invocationGlobalIDs[0].m_data + lVar7))
        ;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x3c);
      pixelCoords[4].m_data[0] = 0;
      pixelCoords[4].m_data[1] = 0;
      pixelCoords[2].m_data[0] = 0;
      pixelCoords[2].m_data[1] = 0;
      pixelCoords[3].m_data[0] = 0;
      pixelCoords[3].m_data[1] = 0;
      pixelCoords[0].m_data[0] = 0;
      pixelCoords[0].m_data[1] = 0;
      pixelCoords[1].m_data[0] = 0;
      pixelCoords[1].m_data[1] = 0;
      pIVar8 = invocationGlobalIDs;
      for (lVar7 = -5; lVar7 != 0; lVar7 = lVar7 + 1) {
        y = ((int)lVar7 + 5) * (this->m_endResultImageLayerSize).m_data[0] + iVar6;
        iVar3 = (int)lVar5;
        gid.m_data[1] = iVar3;
        gid.m_data[0] = y;
        gid.m_data[2] = sliceOrFaceNdx_local;
        pIVar8->m_data[2] = sliceOrFaceNdx_local;
        *(undefined8 *)pIVar8->m_data = gid.m_data._0_8_;
        (&local_5a0)[lVar7] = lVar5 << 0x20 | (ulong)y;
        if (bVar9) {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_4b0,(int)local_608,y,iVar3);
          pixelCoords[0].m_data[lVar7] = local_4b0._0_4_;
          iVar3 = getAtomicFuncArgument(this->m_operation,&gid,&local_5f8);
          pixelCoords[0].m_data[lVar7 + -5] = iVar3;
        }
        else {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_4b0,(int)local_608,y,iVar3);
          pixelCoords[0].m_data[lVar7] = local_4b0._0_4_;
          iVar3 = getAtomicFuncArgument(this->m_operation,&gid,&local_5f8);
          pixelCoords[0].m_data[lVar7 + -5] = (int)(float)iVar3;
        }
        pIVar8 = pIVar8 + 1;
      }
      operation = this->m_operation;
      if (bVar9) {
        iVar3 = -1;
        if (operation < ATOMIC_OPERATION_COMP_SWAP) {
          iVar3 = *(int *)(&DAT_018a5f9c + (ulong)operation * 4);
        }
        local_4b0._0_8_ = (ulong)(uint3)local_4b0._5_3_ << 0x28;
        bVar2 = verifyRecursive<int>
                          (operation,0,iVar3,(bool (*) [5])local_4b0,(int (*) [5])&atomicArgs,
                           (int (*) [5])&returnValues);
      }
      else {
        valueSoFar = -1.0;
        if (operation < ATOMIC_OPERATION_COMP_SWAP) {
          valueSoFar = *(float *)(&DAT_018a5fb8 + (ulong)operation * 4);
        }
        local_4b0._0_8_ = (ulong)(uint3)local_4b0._5_3_ << 0x28;
        bVar2 = verifyRecursive<float>
                          (operation,0,valueSoFar,(bool (*) [5])local_4b0,(float (*) [5])&atomicArgs
                           ,(float (*) [5])&returnValues);
      }
      if (bVar2 == false) {
        this_00 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = local_600;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"// Failure: intermediate return values at pixels ");
        arrayStr<tcu::Vector<int,2>,5>(&local_518,(Functional *)pixelCoords,arr);
        uVar4 = local_5a0;
        std::operator<<((ostream *)this_00,(string *)&local_518);
        std::operator<<((ostream *)this_00," of current layer are ");
        if (bVar9) {
          arrayStr<int,5>(&local_558,(Functional *)&returnValues,(int (*) [5])arr_00);
        }
        else {
          arrayStr<float,5>(&local_558,(Functional *)&returnValues,arr_00);
        }
        std::operator<<((ostream *)this_00,(string *)&local_558);
        gid.m_data._0_8_ =
             tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        this_01 = (ostringstream *)(gid.m_data + 2);
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::operator<<((ostream *)this_01,"// Note: relevant shader invocation global IDs are ");
        arrayStr<tcu::Vector<int,3>,5>(&local_538,(Functional *)invocationGlobalIDs,arr_01);
        std::operator<<((ostream *)this_01,(string *)&local_538);
        local_4b0._0_8_ =
             tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&gid,(EndMessageToken *)&tcu::TestLog::EndMessage);
        this_02 = (ostringstream *)(local_4b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_02);
        std::operator<<((ostream *)this_02,"// Note: data expression values for the IDs are ");
        if (bVar9) {
          arrayStr<int,5>(&local_578,(Functional *)&atomicArgs,(int (*) [5])arr_02);
        }
        else {
          arrayStr<float,5>(&local_578,(Functional *)&atomicArgs,arr_02);
        }
        std::operator<<((ostream *)this_02,(string *)&local_578);
        std::operator<<((ostream *)this_02,
                        "; return values are not a valid result for any order of operations");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_578);
        std::__cxx11::ostringstream::~ostringstream(this_02);
        std::__cxx11::string::~string((string *)&local_538);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        std::__cxx11::string::~string((string *)&local_558);
        std::__cxx11::string::~string((string *)&local_518);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        goto LAB_0125bc9c;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		const bool		isIntegerFormat		(isFormatTypeInteger(resultSlice.getFormat().type));
		const IVec2		dispatchSizeXY	(resultSlice.getWidth(), resultSlice.getHeight());

		DE_ASSERT(resultSlice.getWidth()	== NUM_INVOCATIONS_PER_PIXEL*m_endResultImageLayerSize.x()	&&
				  resultSlice.getHeight()	== m_endResultImageLayerSize.y()							&&
				  resultSlice.getDepth()	== 1);

		log << TestLog::Image("ReturnValues" + toString(sliceOrFaceNdx),
							  "Per-Invocation Return Values, "
								   + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																	  : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < m_endResultImageLayerSize.y(); y++)
		for (int x = 0; x < m_endResultImageLayerSize.x(); x++)
		{
			union IntFloatArr
			{
				int		i[NUM_INVOCATIONS_PER_PIXEL];
				float	f[NUM_INVOCATIONS_PER_PIXEL];
			};

			// Get the atomic function args and return values for all the invocations that contribute to the pixel (x, y) in the current end result slice.

			IntFloatArr		returnValues;
			IntFloatArr		atomicArgs;
			IVec3			invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			IVec2			pixelCoords[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec2 pixCoord	(x + i*m_endResultImageLayerSize.x(), y);
				const IVec3 gid			(pixCoord.x(), pixCoord.y(), sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				pixelCoords[i]			= pixCoord;

				if (isIntegerFormat)
				{
					returnValues.i[i]	= resultSlice.getPixelInt(gid.x(), y).x();
					atomicArgs.i[i]		= getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
				}
				else
				{
					returnValues.f[i]	= resultSlice.getPixel(gid.x(), y).x();
					atomicArgs.f[i]		= (float)getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
				}
			}

			// Verify that the return values form a valid sequence.

			{
				const bool success = isIntegerFormat ? verifyOperationAccumulationIntermediateValues(m_operation,
																									 getOperationInitialValue(m_operation),
																									 atomicArgs.i,
																									 returnValues.i)

													 : verifyOperationAccumulationIntermediateValues(m_operation,
																									 (float)getOperationInitialValue(m_operation),
																									 atomicArgs.f,
																									 returnValues.f);

				if (!success)
				{
					log << TestLog::Message << "// Failure: intermediate return values at pixels " << arrayStr(pixelCoords) << " of current layer are "
											<< (isIntegerFormat ? arrayStr(returnValues.i) : arrayStr(returnValues.f)) << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: data expression values for the IDs are "
											<< (isIntegerFormat ? arrayStr(atomicArgs.i) : arrayStr(atomicArgs.f))
											<< "; return values are not a valid result for any order of operations" << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}